

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffClass(NodeDiffComputer *this,ClassDecl *lhs,ClassDecl *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  
  iVar1 = diffNodes(this,&lhs->_key->super_Node,&rhs->_key->super_Node);
  iVar2 = iVar1;
  if ((iVar1 <= this->limit) &&
     (iVar2 = diffNodes(this,&lhs->_base->super_Node,&rhs->_base->super_Node), iVar2 <= this->limit)
     ) {
    iVar3 = diffTable(this,&lhs->super_TableDecl,&rhs->super_TableDecl);
    iVar4 = 0;
    if (iVar3 <= this->limit) {
      iVar4 = iVar2 + iVar1;
    }
    iVar2 = iVar4 + iVar3;
  }
  return iVar2;
}

Assistant:

int32_t diffClass(const ClassDecl *lhs, const ClassDecl *rhs) {
    int32_t keyDiff = diffNodes(lhs->classKey(), rhs->classKey());

    if (keyDiff > limit)
      return keyDiff;

    int32_t baseDiff = diffNodes(lhs->classBase(), rhs->classBase());

    if (baseDiff > limit)
      return baseDiff;

    int32_t bodyDiff = diffTable(lhs, rhs);

    if (bodyDiff > limit)
      return bodyDiff;

    return keyDiff + baseDiff + bodyDiff;
  }